

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O2

bool __thiscall
std::less<gvr::(anonymous_namespace)::VertexNormalIndex>::operator()
          (less<gvr::(anonymous_namespace)::VertexNormalIndex> *this,VertexNormalIndex *__x,
          VertexNormalIndex *__y)

{
  float fVar1;
  bool bVar2;
  float fVar3;
  
  fVar3 = *(float *)this;
  fVar1 = __x->x;
  bVar2 = true;
  if (fVar1 <= fVar3) {
    if ((fVar3 == fVar1) && (!NAN(fVar3) && !NAN(fVar1))) {
      fVar3 = *(float *)(this + 4);
      fVar1 = __x->y;
      if (fVar3 < fVar1) {
        return true;
      }
      if ((fVar3 == fVar1) && (!NAN(fVar3) && !NAN(fVar1))) {
        fVar3 = *(float *)(this + 8);
        fVar1 = __x->z;
        if (fVar3 < fVar1) {
          return true;
        }
        if ((fVar3 == fVar1) && (!NAN(fVar3) && !NAN(fVar1))) {
          if (*(float *)(this + 0xc) < __x->nx + -0.1) {
            return true;
          }
          if (*(float *)(this + 0xc) < __x->nx + 0.1) {
            if (*(float *)(this + 0x10) < __x->ny + -0.1) {
              return true;
            }
            if ((*(float *)(this + 0x10) < __x->ny + 0.1) &&
               (fVar3 = __x->nz + -0.1,
               *(float *)(this + 0x14) <= fVar3 && fVar3 != *(float *)(this + 0x14))) {
              return true;
            }
          }
        }
      }
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool operator<(const VertexNormalIndex &a, const VertexNormalIndex &b)
{
  float eps=0.1f;

  if (a.x < b.x)
  {
    return true;
  }
  else if (a.x == b.x)
  {
    if (a.y < b.y)
    {
      return true;
    }
    else if (a.y == b.y)
    {
      if (a.z < b.z)
      {
        return true;
      }
      else if (a.z == b.z)
      {
        if (a.nx < b.nx-eps)
        {
          return true;
        }
        else if (a.nx < b.nx+eps)
        {
          if (a.ny < b.ny-eps)
          {
            return true;
          }
          else if (a.ny < b.ny+eps)
          {
            if (a.nz < b.nz-eps)
            {
              return true;
            }
          }
        }
      }
    }
  }

  return false;
}